

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidgets.cpp
# Opt level: O1

State __thiscall QAccessibleTextEdit::state(QAccessibleTextEdit *this)

{
  bool bVar1;
  State SVar2;
  QWidget *this_00;
  uint uVar3;
  
  SVar2 = QAccessibleWidget::state((QAccessibleWidget *)this);
  this_00 = QAccessibleWidget::widget((QAccessibleWidget *)this);
  bVar1 = QTextEdit::isReadOnly((QTextEdit *)this_00);
  uVar3 = SVar2._0_4_ | 0x100;
  if (!bVar1) {
    uVar3 = SVar2._0_4_;
  }
  return (State)((ulong)uVar3 | (ulong)SVar2 & 0xf900000000 | (ulong)!bVar1 << 0x20 |
                0xaaaaaa0600000000);
}

Assistant:

QAccessible::State QAccessibleTextEdit::state() const
{
    QAccessible::State st = QAccessibleTextWidget::state();
    if (textEdit()->isReadOnly())
        st.readOnly = true;
    else
        st.editable = true;
    return st;
}